

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O0

void __thiscall flow::MatchSame::MatchSame(MatchSame *this,MatchDef *def,Program *program)

{
  uint64_t uVar1;
  bool bVar2;
  reference pMVar3;
  ConstantPool *this_00;
  FlowString *__k;
  mapped_type *pmVar4;
  MatchCaseDef *one;
  const_iterator __end1;
  const_iterator __begin1;
  vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_> *__range1;
  Program *program_local;
  MatchDef *def_local;
  MatchSame *this_local;
  
  Match::Match(&this->super_Match,def);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchSame_002d3a00;
  memset(&this->map_,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->map_);
  __end1 = std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::begin(&def->cases);
  one = (MatchCaseDef *)
        std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::end(&def->cases);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
                                *)&one);
    if (!bVar2) break;
    pMVar3 = __gnu_cxx::
             __normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
             ::operator*(&__end1);
    uVar1 = pMVar3->pc;
    this_00 = Program::constants(program);
    __k = ConstantPool::getString_abi_cxx11_(this_00,pMVar3->label);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->map_,__k);
    *pmVar4 = uVar1;
    __gnu_cxx::
    __normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

MatchSame::MatchSame(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_[program->constants().getString(one.label)] = one.pc;
  }
}